

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

ADAPTER_TYPE Diligent::VkPhysicalDeviceTypeToAdapterType(VkPhysicalDeviceType DeviceType)

{
  ADAPTER_TYPE local_9;
  VkPhysicalDeviceType DeviceType_local;
  
  switch(DeviceType) {
  case VK_PHYSICAL_DEVICE_TYPE_OTHER:
  default:
    local_9 = ADAPTER_TYPE_UNKNOWN;
    break;
  case VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU:
    local_9 = ADAPTER_TYPE_INTEGRATED;
    break;
  case VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU:
    local_9 = ADAPTER_TYPE_DISCRETE;
    break;
  case VK_PHYSICAL_DEVICE_TYPE_CPU:
    local_9 = ADAPTER_TYPE_SOFTWARE;
  }
  return local_9;
}

Assistant:

ADAPTER_TYPE VkPhysicalDeviceTypeToAdapterType(VkPhysicalDeviceType DeviceType)
{
    switch (DeviceType)
    {
        // clang-format off
        case VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU: return ADAPTER_TYPE_INTEGRATED;
        case VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU:   return ADAPTER_TYPE_DISCRETE;
        case VK_PHYSICAL_DEVICE_TYPE_CPU:            return ADAPTER_TYPE_SOFTWARE;
        case VK_PHYSICAL_DEVICE_TYPE_OTHER:
        default:                                     return ADAPTER_TYPE_UNKNOWN;
            // clang-format on
    }
}